

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>::dx
          (FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_> *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Fad<double> *pFVar4;
  FadExpr<FadFuncCosh<Fad<double>_>_> *pFVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  pFVar4 = this->left_;
  pdVar6 = &pFVar4->defaultVal;
  if ((pFVar4->dx_).num_elts != 0) {
    pdVar6 = (pFVar4->dx_).ptr_to_data + i;
  }
  dVar1 = *pdVar6;
  dVar7 = cosh((this->right_->fadexpr_).expr_.val_);
  pFVar5 = this->right_;
  pdVar6 = &(pFVar5->fadexpr_).expr_.defaultVal;
  if ((pFVar5->fadexpr_).expr_.dx_.num_elts != 0) {
    pdVar6 = (pFVar5->fadexpr_).expr_.dx_.ptr_to_data + i;
  }
  dVar2 = *pdVar6;
  dVar8 = sinh((pFVar5->fadexpr_).expr_.val_);
  dVar3 = this->left_->val_;
  dVar9 = cosh((this->right_->fadexpr_).expr_.val_);
  dVar10 = cosh((this->right_->fadexpr_).expr_.val_);
  return (dVar7 * dVar1 - dVar8 * dVar2 * dVar3) / (dVar10 * dVar9);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}